

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

void __thiscall QGraphicsItem::update(QGraphicsItem *this,QRectF *rect)

{
  double dVar1;
  double dVar2;
  QGraphicsItemPrivate *this_00;
  QGraphicsScene *pQVar3;
  QGraphicsItemCache *pQVar4;
  
  dVar1 = rect->w;
  dVar2 = rect->h;
  if (((0.0 < dVar1) && (0.0 < dVar2)) ||
     ((dVar1 == 0.0 && (((!NAN(dVar1) && (dVar2 == 0.0)) && (!NAN(dVar2))))))) {
    QGraphicsItemPrivate::invalidateParentGraphicsEffectsRecursively((this->d_ptr).d);
    this_00 = (this->d_ptr).d;
    if ((this_00->field_0x162 & 0x60) != 0) {
      pQVar4 = QGraphicsItemPrivate::extraItemCache(this_00);
      if (pQVar4->allExposed == false) {
        if (((rect->w != 0.0) || (NAN(rect->w))) || ((rect->h != 0.0 || (NAN(rect->h))))) {
          QtPrivate::QMovableArrayOps<QRectF>::emplace<QRectF_const&>
                    ((QMovableArrayOps<QRectF> *)&pQVar4->exposed,(pQVar4->exposed).d.size,rect);
          QList<QRectF>::end(&pQVar4->exposed);
        }
        else {
          pQVar4->allExposed = true;
          QList<QRectF>::clear(&pQVar4->exposed);
        }
      }
      if ((((this->d_ptr).d)->field_0x163 & 0x80) != 0) {
        return;
      }
    }
    pQVar3 = ((this->d_ptr).d)->scene;
    if (pQVar3 != (QGraphicsScene *)0x0) {
      QGraphicsScenePrivate::markDirty
                (*(QGraphicsScenePrivate **)&pQVar3->field_0x8,this,rect,false,false,false,false,
                 false);
    }
  }
  return;
}

Assistant:

void QGraphicsItem::update(const QRectF &rect)
{
    if (rect.isEmpty() && !rect.isNull())
        return;

    // Make sure we notify effects about invalidated source.
#if QT_CONFIG(graphicseffect)
    d_ptr->invalidateParentGraphicsEffectsRecursively();
#endif // QT_CONFIG(graphicseffect)

    if (CacheMode(d_ptr->cacheMode) != NoCache) {
        // Invalidate cache.
        QGraphicsItemCache *cache = d_ptr->extraItemCache();
        if (!cache->allExposed) {
            if (rect.isNull()) {
                cache->allExposed = true;
                cache->exposed.clear();
            } else {
                cache->exposed.append(rect);
            }
        }
        // Only invalidate cache; item is already dirty.
        if (d_ptr->fullUpdatePending)
            return;
    }

    if (d_ptr->scene)
        d_ptr->scene->d_func()->markDirty(this, rect);
}